

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O2

int anon_unknown.dwarf_22b2f::ChannelOut_noteoff(lua_State *L)

{
  ChannelOut *this;
  ulong xs_1;
  ulong xs_2;
  
  this = getChannelOut(L,1);
  xs_1 = luaL_checkinteger(L,2);
  xs_2 = luaL_optinteger(L,3,0);
  if (0x7f < xs_1) {
    luaL_argerror(L,2,"Pitch must be between 0 and 127");
  }
  if (0x7f < xs_2) {
    luaL_argerror(L,3,"Velocity must be between 0 and 127");
  }
  ChannelOut::send<int,long,long>(this,this->index + 0x80,xs_1,xs_2);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_noteoff(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	lua_Integer pitch = luaL_checkinteger(L, 2);
	lua_Integer velocity = luaL_optinteger(L, 3, 0);

	luaL_argcheck(L, pitch >= 0 && pitch <= 0x7F, 2, "Pitch must be between 0 and 127");
	luaL_argcheck(L, velocity >= 0 && velocity <= 0x7F, 3, "Velocity must be between 0 and 127");

	self.send(0x80 + self.index, pitch, velocity);
	lua_settop(L, 1);
	return 1;
}